

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_stdin(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_loop_t *loop;
  uv_timer_t *loop_00;
  int extraout_EDX;
  int iVar4;
  uv_stream_t *handle;
  uv_process_t *puVar5;
  uv_timer_t *puVar6;
  code *pcVar7;
  char *handle_00;
  char buffer [23];
  uv_buf_t buf;
  uv_stdio_container_t stdio [2];
  uv_pipe_t in;
  uv_pipe_t out;
  uv_write_t write_req;
  uv_os_fd_t uStack_5fc;
  sockaddr_in sStack_5f8;
  uv_stdio_container_t uStack_5e8;
  undefined4 uStack_5d8;
  undefined4 uStack_5d0;
  undefined4 uStack_5c8;
  undefined4 uStack_5c0;
  undefined4 uStack_5b8;
  int iStack_5b0;
  uv_loop_t *puStack_5a8;
  uv_tcp_t uStack_5a0;
  uv_stdio_container_t uStack_4a8;
  undefined4 uStack_498;
  undefined4 uStack_488;
  undefined4 uStack_478;
  uv_loop_t *puStack_470;
  uv_stream_t uStack_460;
  uv_loop_t *puStack_358;
  anon_union_8_2_26168aa3_for_data aStack_350;
  undefined1 local_338 [32];
  uv_buf_t local_318;
  uv_stdio_container_t local_308;
  int local_2f8;
  uv_loop_t *local_2f0;
  uv_stream_t local_2e8;
  undefined1 local_1e0 [456];
  
  loop = (uv_loop_t *)local_338;
  local_338[0] = 'h';
  local_338[1] = 'e';
  local_338[2] = 'l';
  local_338[3] = 'l';
  local_338[4] = 'o';
  local_338[5] = '-';
  local_338[6] = 'f';
  local_338[7] = 'r';
  local_338._8_7_ = 0x776170732d6d6f;
  local_338[0xf] = 'n';
  local_338._16_7_ = 0x6e696474735f;
  init_process_options("spawn_helper3",exit_cb);
  puVar2 = uv_default_loop();
  puVar3 = (uv_loop_t *)local_1e0;
  uv_pipe_init(puVar2,(uv_pipe_t *)puVar3,0);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,(uv_pipe_t *)&local_2e8,0);
  options.stdio = &local_308;
  local_308.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  local_2f8 = 0x21;
  options.stdio_count = 2;
  local_308.data.stream = &local_2e8;
  local_2f0 = puVar3;
  puVar2 = uv_default_loop();
  iVar4 = 0x34b410;
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    local_318.len = 0x17;
    puVar2 = (uv_loop_t *)(local_1e0 + 0x108);
    handle = &local_2e8;
    local_318.base = local_338;
    iVar1 = uv_write((uv_write_t *)puVar2,handle,&local_318,1,write_cb);
    iVar4 = (int)handle;
    if (iVar1 != 0) goto LAB_00177a1e;
    iVar4 = 0x176e97;
    puVar2 = (uv_loop_t *)local_1e0;
    iVar1 = uv_read_start((uv_stream_t *)puVar2,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_00177a23;
    puVar2 = uv_default_loop();
    iVar4 = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00177a28;
    if (exit_cb_called != 1) goto LAB_00177a2d;
    if (close_cb_called != 3) goto LAB_00177a32;
    iVar4 = 0x34b4a0;
    iVar1 = strcmp(local_338,output);
    if (iVar1 != 0) goto LAB_00177a37;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    iVar4 = 0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    loop = uv_default_loop();
    iVar1 = uv_loop_close(loop);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_stdin_cold_1();
LAB_00177a1e:
    run_test_spawn_stdin_cold_2();
LAB_00177a23:
    run_test_spawn_stdin_cold_3();
LAB_00177a28:
    run_test_spawn_stdin_cold_4();
LAB_00177a2d:
    run_test_spawn_stdin_cold_5();
LAB_00177a32:
    loop = puVar2;
    run_test_spawn_stdin_cold_6();
LAB_00177a37:
    run_test_spawn_stdin_cold_7();
  }
  run_test_spawn_stdin_cold_8();
  if (iVar4 == 0) {
    uv_close((uv_handle_t *)loop->pending_queue[1],close_cb);
    return extraout_EAX;
  }
  write_cb_cold_1();
  uStack_5a0.queued_fds = (void *)0x177a79;
  puStack_358 = puVar3;
  aStack_350.stream = &local_2e8;
  init_process_options("spawn_helper5",exit_cb);
  uStack_5a0.queued_fds = (void *)0x177a7e;
  puVar2 = uv_default_loop();
  puVar3 = (uv_loop_t *)&uStack_460;
  uStack_5a0.queued_fds = (void *)0x177a92;
  uv_pipe_init(puVar2,(uv_pipe_t *)puVar3,0);
  uStack_4a8.flags = UV_IGNORE;
  uStack_498 = 0;
  uStack_488 = 0;
  uStack_478 = 0x21;
  options.stdio_count = 4;
  uStack_5a0.queued_fds = (void *)0x177ac5;
  options.stdio = &uStack_4a8;
  puStack_470 = puVar3;
  puVar2 = uv_default_loop();
  uStack_5a0.queued_fds = (void *)0x177ad7;
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    uStack_5a0.queued_fds = (void *)0x177af7;
    iVar1 = uv_read_start(&uStack_460,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_00177bb8;
    uStack_5a0.queued_fds = (void *)0x177b04;
    puVar2 = uv_default_loop();
    uStack_5a0.queued_fds = (void *)0x177b0e;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00177bbd;
    if (exit_cb_called != 1) goto LAB_00177bc2;
    if (close_cb_called != 2) goto LAB_00177bc7;
    uStack_5a0.queued_fds = (void *)0x177b45;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT71(output._8_7_,output[7]) != 0xa216f69647473 ||
        CONCAT17(output[7],output._0_7_) != 0x7320687472756f66) goto LAB_00177bcc;
    uStack_5a0.queued_fds = (void *)0x177b71;
    puVar3 = uv_default_loop();
    uStack_5a0.queued_fds = (void *)0x177b85;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uStack_5a0.queued_fds = (void *)0x177b8f;
    uv_run(puVar3,UV_RUN_DEFAULT);
    uStack_5a0.queued_fds = (void *)0x177b94;
    puVar2 = uv_default_loop();
    uStack_5a0.queued_fds = (void *)0x177b9c;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uStack_5a0.queued_fds = (void *)0x177ba5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_5a0.queued_fds = (void *)0x177bb8;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_00177bb8:
    uStack_5a0.queued_fds = (void *)0x177bbd;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_00177bbd:
    uStack_5a0.queued_fds = (void *)0x177bc2;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_00177bc2:
    uStack_5a0.queued_fds = (void *)0x177bc7;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_00177bc7:
    uStack_5a0.queued_fds = (void *)0x177bcc;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_00177bcc:
    uStack_5a0.queued_fds = (void *)0x177bd1;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStack_5a0.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStack_5a8 = (uv_loop_t *)0x177be2;
  puVar2 = uv_default_loop();
  puStack_5a8 = (uv_loop_t *)0x177bed;
  iVar1 = uv_tcp_init(puVar2,&uStack_5a0);
  if (iVar1 == 0) {
    puStack_5a8 = (uv_loop_t *)0x177bfe;
    iVar1 = uv_tcp_open(&uStack_5a0,3);
    if (iVar1 != 0) goto LAB_00177c27;
    puStack_5a8 = (uv_loop_t *)0x177c11;
    iVar1 = uv_listen((uv_stream_t *)&uStack_5a0,0x1000,(uv_connection_cb)0x0);
    if (iVar1 == 0) {
      return 1;
    }
  }
  else {
    puStack_5a8 = (uv_loop_t *)0x177c27;
    spawn_tcp_server_helper_cold_1();
LAB_00177c27:
    puStack_5a8 = (uv_loop_t *)0x177c2c;
    spawn_tcp_server_helper_cold_2();
  }
  puStack_5a8 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStack_5a8 = puVar3;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_5f8);
  if (iVar1 == 0) {
    uStack_5fc = -1;
    puVar3 = uv_default_loop();
    iVar1 = uv_tcp_init_ex(puVar3,&tcp_server,2);
    if (iVar1 != 0) goto LAB_00177d97;
    iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStack_5f8,0);
    if (iVar1 != 0) goto LAB_00177d9c;
    iVar1 = uv_fileno((uv_handle_t *)&tcp_server,&uStack_5fc);
    if (iVar1 != 0) goto LAB_00177da1;
    if (uStack_5fc < 1) goto LAB_00177da6;
    options.stdio = &uStack_5e8;
    uStack_5e8.flags = UV_INHERIT_FD;
    uStack_5e8.data.fd = 0;
    uStack_5d8 = 2;
    uStack_5d0 = 1;
    uStack_5c8 = 2;
    uStack_5c0 = 2;
    uStack_5b8 = 2;
    iStack_5b0 = uStack_5fc;
    options.stdio_count = 4;
    puVar3 = uv_default_loop();
    iVar1 = uv_spawn(puVar3,&process,&options);
    if (iVar1 != 0) goto LAB_00177dab;
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00177db0;
    if (exit_cb_called != 1) goto LAB_00177db5;
    if (close_cb_called != 1) goto LAB_00177dba;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_00177d97:
    run_test_spawn_tcp_server_cold_2();
LAB_00177d9c:
    run_test_spawn_tcp_server_cold_3();
LAB_00177da1:
    run_test_spawn_tcp_server_cold_4();
LAB_00177da6:
    run_test_spawn_tcp_server_cold_5();
LAB_00177dab:
    run_test_spawn_tcp_server_cold_6();
LAB_00177db0:
    run_test_spawn_tcp_server_cold_7();
LAB_00177db5:
    run_test_spawn_tcp_server_cold_8();
LAB_00177dba:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  puVar3 = uv_default_loop();
  iVar1 = uv_spawn(puVar3,&process,&options);
  if (iVar1 == 0) {
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00177e76;
    if (exit_cb_called != 1) goto LAB_00177e7b;
    if (close_cb_called != 1) goto LAB_00177e80;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_00177e76:
    run_test_spawn_ignored_stdio_cold_2();
LAB_00177e7b:
    run_test_spawn_ignored_stdio_cold_3();
LAB_00177e80:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  loop_00 = (uv_timer_t *)uv_default_loop();
  puVar5 = &process;
  iVar1 = uv_spawn((uv_loop_t *)loop_00,&process,&options);
  if (iVar1 == 0) {
    loop_00 = (uv_timer_t *)uv_default_loop();
    puVar6 = &timer;
    iVar1 = uv_timer_init((uv_loop_t *)loop_00,&timer);
    pcVar7 = (code *)puVar6;
    if (iVar1 != 0) goto LAB_00177f62;
    loop_00 = &timer;
    pcVar7 = timer_cb;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar1 != 0) goto LAB_00177f67;
    loop_00 = (uv_timer_t *)uv_default_loop();
    pcVar7 = (code *)0x0;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00177f6c;
    if (exit_cb_called != 1) goto LAB_00177f71;
    if (close_cb_called != 2) goto LAB_00177f76;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    pcVar7 = (code *)0x0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    loop_00 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar7 = (code *)puVar5;
LAB_00177f62:
    run_test_spawn_and_kill_cold_2();
LAB_00177f67:
    run_test_spawn_and_kill_cold_3();
LAB_00177f6c:
    run_test_spawn_and_kill_cold_4();
LAB_00177f71:
    run_test_spawn_and_kill_cold_5();
LAB_00177f76:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  handle_00 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar7 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close((uv_handle_t *)loop_00,close_cb);
      handle_00 = (char *)(ulong)*(uint *)&((uv_loop_t *)loop_00)->watchers;
      iVar1 = uv_kill(*(uint *)&((uv_loop_t *)loop_00)->watchers,0);
      if (iVar1 == -3) {
        return -3;
      }
      goto LAB_00177fd5;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_00177fd5:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close((uv_handle_t *)handle_00,close_cb);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_stdin) {
  int r;
  uv_pipe_t out;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  char buffer[] = "hello-from-spawn_stdin";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  buf.base = buffer;
  buf.len = sizeof(buffer);
  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3); /* Once for process twice for the pipe. */
  ASSERT(strcmp(buffer, output) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}